

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O2

void __thiscall
Eigen::GeneralProduct<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,5>::
scaleAndAddTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>
           *this,Matrix<double,__1,__1,_0,__1,__1> *dst,Scalar *alpha)

{
  Scalar SVar1;
  long rows;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar2;
  long cols;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar3;
  long depth;
  BlockingType blocking;
  gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false> local_98;
  gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false>_>
  local_50;
  
  rows = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  pMVar2 = *(Matrix<double,__1,__1,_0,__1,__1> **)this;
  if (rows == (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows) {
    cols = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
    pMVar3 = *(Matrix<double,__1,__1,_0,__1,__1> **)(this + 8);
    if (cols == (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                .m_cols) {
      if (((cols != 0) && (rows != 0)) &&
         (depth = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_cols, depth != 0)) {
        SVar1 = *alpha;
        internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>::gemm_blocking_space
                  (&local_98,rows,cols,depth);
        local_50.m_lhs = pMVar2;
        local_50.m_rhs = pMVar3;
        local_50.m_dest = dst;
        local_50.m_actualAlpha = SVar1;
        local_50.m_blocking = &local_98;
        internal::
        parallelize_gemm<true,Eigen::internal::gemm_functor<double,long,Eigen::internal::general_matrix_matrix_product<long,double,0,false,double,0,false,0>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::gemm_blocking_space<0,double,double,_1,_1,_1,1,false>>,long>
                  (&local_50,*(long *)(*(long *)this + 8),*(long *)(*(long *)(this + 8) + 0x10),
                   false);
        internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>::~gemm_blocking_space
                  (&local_98);
      }
      return;
    }
  }
  __assert_fail("dst.rows()==m_lhs.rows() && dst.cols()==m_rhs.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/preritj[P]Extended-Kalman-Filter/src/Eigen/src/Core/products/GeneralMatrixMatrix.h"
                ,0x193,
                "void Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>::scaleAndAddTo(Dest &, const Scalar &) const [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, ProductType = 5, Dest = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

void scaleAndAddTo(Dest& dst, const Scalar& alpha) const
    {
      eigen_assert(dst.rows()==m_lhs.rows() && dst.cols()==m_rhs.cols());
      if(m_lhs.cols()==0 || m_lhs.rows()==0 || m_rhs.cols()==0)
        return;

      typename internal::add_const_on_value_type<ActualLhsType>::type lhs = LhsBlasTraits::extract(m_lhs);
      typename internal::add_const_on_value_type<ActualRhsType>::type rhs = RhsBlasTraits::extract(m_rhs);

      Scalar actualAlpha = alpha * LhsBlasTraits::extractScalarFactor(m_lhs)
                                 * RhsBlasTraits::extractScalarFactor(m_rhs);

      typedef internal::gemm_blocking_space<(Dest::Flags&RowMajorBit) ? RowMajor : ColMajor,LhsScalar,RhsScalar,
              Dest::MaxRowsAtCompileTime,Dest::MaxColsAtCompileTime,MaxDepthAtCompileTime> BlockingType;

      typedef internal::gemm_functor<
        Scalar, Index,
        internal::general_matrix_matrix_product<
          Index,
          LhsScalar, (_ActualLhsType::Flags&RowMajorBit) ? RowMajor : ColMajor, bool(LhsBlasTraits::NeedToConjugate),
          RhsScalar, (_ActualRhsType::Flags&RowMajorBit) ? RowMajor : ColMajor, bool(RhsBlasTraits::NeedToConjugate),
          (Dest::Flags&RowMajorBit) ? RowMajor : ColMajor>,
        _ActualLhsType, _ActualRhsType, Dest, BlockingType> GemmFunctor;

      BlockingType blocking(dst.rows(), dst.cols(), lhs.cols());

      internal::parallelize_gemm<(Dest::MaxRowsAtCompileTime>32 || Dest::MaxRowsAtCompileTime==Dynamic)>(GemmFunctor(lhs, rhs, dst, actualAlpha, blocking), this->rows(), this->cols(), Dest::Flags&RowMajorBit);
    }